

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::DecimalFormat::format
          (DecimalFormat *this,int64_t number,UnicodeString *appendTo,FieldPosition *pos)

{
  short sVar1;
  bool bVar2;
  int32_t offset;
  FormattedNumber output;
  UErrorCode localStatus;
  UnicodeStringAppendable appendable;
  undefined1 local_50 [24];
  UnicodeStringAppendable local_38;
  
  if ((pos->fField == -1) && (bVar2 = fastFormatInt64(this,number,appendTo), bVar2)) {
    return appendTo;
  }
  local_50._20_4_ = 0;
  icu_63::number::LocalizedNumberFormatter::formatInt
            ((LocalizedNumberFormatter *)local_50,
             (int64_t)(this->fields->formatter).
                      super_LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>.ptr,
             (UErrorCode *)number);
  sVar1 = (appendTo->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    offset = (appendTo->fUnion).fFields.fLength;
  }
  else {
    offset = (int)sVar1 >> 5;
  }
  fieldPositionHelper((FormattedNumber *)local_50,pos,offset,(UErrorCode *)(local_50 + 0x14));
  local_38.super_Appendable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeStringAppendable_003a72d0;
  local_38.str = appendTo;
  icu_63::number::FormattedNumber::appendTo((FormattedNumber *)local_50,&local_38.super_Appendable);
  UnicodeStringAppendable::~UnicodeStringAppendable(&local_38);
  icu_63::number::FormattedNumber::~FormattedNumber((FormattedNumber *)local_50);
  return appendTo;
}

Assistant:

UnicodeString& DecimalFormat::format(int64_t number, UnicodeString& appendTo, FieldPosition& pos) const {
    if (pos.getField() == FieldPosition::DONT_CARE && fastFormatInt64(number, appendTo)) {
        return appendTo;
    }
    UErrorCode localStatus = U_ZERO_ERROR;
    FormattedNumber output = fields->formatter->formatInt(number, localStatus);
    fieldPositionHelper(output, pos, appendTo.length(), localStatus);
    auto appendable = UnicodeStringAppendable(appendTo);
    output.appendTo(appendable);
    return appendTo;
}